

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::makeFromMemory
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Type p,
          ExpressionRunner<wasm::ModuleRunner> *param_4,undefined8 param_5)

{
  Literal local_80;
  short local_66;
  int16_t i_1;
  Literal local_58;
  char local_39;
  ExpressionRunner<wasm::ModuleRunner> *pEStack_38;
  int8_t i;
  uintptr_t local_30;
  void *p_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Field field_local;
  
  _field_local = (int)param_5;
  local_30 = p.id;
  p_local = this;
  this_local = param_4;
  _field_local = param_5;
  if (_field_local == 0) {
    pEStack_38 = param_4;
    ::wasm::Literal::makeFromMemory(__return_storage_ptr__,p);
  }
  else if (_field_local == 1) {
    local_39 = *(char *)p.id;
    wasm::Literal::Literal(&local_58,(int)local_39);
    truncateForPacking(__return_storage_ptr__,this,&local_58,(Field *)&this_local);
    ::wasm::Literal::~Literal(&local_58);
  }
  else {
    if (_field_local != 2) {
      ::wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x977);
    }
    local_66 = *(short *)p.id;
    wasm::Literal::Literal(&local_80,(int)local_66);
    truncateForPacking(__return_storage_ptr__,this,&local_80,(Field *)&this_local);
    ::wasm::Literal::~Literal(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal makeFromMemory(void* p, Field field) {
    switch (field.packedType) {
      case Field::not_packed:
        return Literal::makeFromMemory(p, field.type);
      case Field::i8: {
        int8_t i;
        memcpy(&i, p, sizeof(i));
        return truncateForPacking(Literal(int32_t(i)), field);
      }
      case Field::i16: {
        int16_t i;
        memcpy(&i, p, sizeof(i));
        return truncateForPacking(Literal(int32_t(i)), field);
      }
    }
    WASM_UNREACHABLE("unexpected type");
  }